

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::check_frozen_serialization(roaring64_bitmap_t *r1)

{
  char *buf;
  _Bool _Var1;
  size_t b;
  char *buf_00;
  size_t a;
  roaring64_bitmap_t *prVar2;
  
  roaring64_bitmap_shrink_to_fit((roaring64_bitmap_t *)r1);
  assert_r64_valid(r1);
  b = roaring64_bitmap_frozen_size_in_bytes((roaring64_bitmap_t *)r1);
  buf_00 = (char *)roaring_aligned_malloc(0x40,b + 1);
  buf = buf_00 + 1;
  a = roaring64_bitmap_frozen_serialize((roaring64_bitmap_t *)r1,buf);
  _assert_int_equal(a,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x60c);
  prVar2 = roaring64_bitmap_frozen_view(buf,b);
  _assert_true((ulong)(prVar2 == (roaring64_bitmap_t *)0x0),
               "roaring64_bitmap_frozen_view(buf + 1, serialized_size)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x60e);
  memmove(buf_00,buf,b);
  prVar2 = roaring64_bitmap_frozen_view(buf_00,b);
  _assert_true((unsigned_long)prVar2,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x612);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_equals(prVar2,(roaring64_bitmap_t *)r1);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r2, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x614);
  roaring64_bitmap_free(prVar2);
  roaring_aligned_free(buf_00);
  return;
}

Assistant:

void check_frozen_serialization(roaring64_bitmap_t* r1) {
    roaring64_bitmap_shrink_to_fit(r1);
    assert_r64_valid(r1);

    // Serialize to an unaligned buffer, deserialize from an 32-byte aligned
    // buffer.
    size_t serialized_size = roaring64_bitmap_frozen_size_in_bytes(r1);
    char* buf = (char*)roaring_aligned_malloc(64, serialized_size + 1);
    size_t serialized = roaring64_bitmap_frozen_serialize(r1, buf + 1);
    assert_int_equal(serialized, serialized_size);
    // Cannot deserialize from an unaligned buffer.
    assert_null(roaring64_bitmap_frozen_view(buf + 1, serialized_size));
    memmove(buf, buf + 1, serialized_size);

    roaring64_bitmap_t* r2 = roaring64_bitmap_frozen_view(buf, serialized_size);
    assert_non_null(r2);
    assert_r64_valid(r2);
    assert_true(roaring64_bitmap_equals(r2, r1));

    roaring64_bitmap_free(r2);
    roaring_aligned_free(buf);
}